

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  
  poVar1 = std::operator<<(stream,"Usage: ");
  poVar1 = std::operator<<(poVar1,program_name);
  std::operator<<(poVar1,
                  "-combine -i input.exr[:partnum][::partname] [input2.exr[:partnum]][::partname] [...] -o outfile.exr [options]\n"
                 );
  std::operator<<(stream,"  or: exrmultipart -separate -i infile.exr -o outfileBaseName [options]\n"
                 );
  std::operator<<(stream,"  or: exrmultipart -convert -i infile.exr -o outfile.exr [options]\n");
  if (CONCAT31(in_register_00000011,verbose) != 0) {
    std::operator<<(stream,
                    "\nCombine or split multipart data\n\nOptions:\n  -override [0/1]   0 = do not override conflicting shared                         attributes [default]\n                    1 = override conflicting shared attributes\n  -view name        (after specifying -i) assign following inputs to view \'name\'\n  -h, --help        print this message\n\n      --version     print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
                   );
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << "-combine -i input.exr[:partnum][::partname] [input2.exr[:partnum]][::partname] [...] -o outfile.exr [options]\n";
    stream << "  or: exrmultipart -separate -i infile.exr -o outfileBaseName [options]\n";
    stream << "  or: exrmultipart -convert -i infile.exr -o outfile.exr [options]\n";       

    if (verbose)
        stream << "\n"
            "Combine or split multipart data\n"
            "\n"
            "Options:\n"
            "  -override [0/1]   0 = do not override conflicting shared "
            "                        attributes [default]\n"
            "                    1 = override conflicting shared attributes\n"
            "  -view name        (after specifying -i) assign following inputs to view 'name'\n"
            "  -h, --help        print this message\n"
            "\n"
            "      --version     print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}